

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O0

int as154x(double *inp,int N,double *xreg,int optmethod,int p,int d,int q,int s,int P,int D,int Q,
          double *phi,double *theta,double *PHI,double *THETA,double *exog,int r,double *wmean,
          double *var,double *resid,double *loglik,double *hess,int cssml,int start,int imean)

{
  double dVar1;
  int N_00;
  int iVar2;
  int iVar3;
  int iVar4;
  double *oup;
  double *oup_00;
  void *__dest;
  double *A;
  double *pdVar5;
  double *pdVar6;
  xlik_object object;
  double *col;
  double *dx_00;
  int *ipiv_00;
  int local_13c;
  undefined1 local_138 [8];
  custom_function as154_min;
  reg_object fit;
  xlik_object obj;
  double maxstep;
  int *ipiv;
  double *sigma;
  double *coeff;
  double *SIG;
  double *V;
  double *U;
  double *inp2;
  double *x0;
  double *res;
  double *varcovar;
  double *XX;
  double *thess;
  double *dx;
  double *x;
  double *tf;
  double *b;
  int ERR;
  int orig;
  int rnk;
  int N1;
  int offset;
  int nd;
  int ncxreg;
  int ret;
  int length;
  int retval;
  int pq;
  int i;
  int d_local;
  int p_local;
  int optmethod_local;
  double *xreg_local;
  double *pdStack_40;
  int N_local;
  double *inp_local;
  
  if (xreg == (double *)0x0) {
    local_13c = 0;
  }
  else {
    local_13c = r;
  }
  offset = local_13c;
  iVar2 = d + D;
  i = p;
  d_local = optmethod;
  _p_local = xreg;
  xreg_local._4_4_ = N;
  pdStack_40 = inp;
  if (cssml == 1) {
    iVar3 = cssx(inp,N,xreg,optmethod,p,d,q,s,P,D,Q,phi,theta,PHI,THETA,exog,r,wmean,var,loglik,hess
                 ,start,imean);
    if (iVar3 != 1) {
      return iVar3;
    }
    iVar3 = checkroots_cerr(phi,&i,theta,&q,PHI,&P,THETA,&Q);
    if (iVar3 == 10) {
      return 10;
    }
    if (iVar3 == 0xc) {
      return 0xc;
    }
  }
  else if (start == 0) {
    for (retval = 0; retval < p; retval = retval + 1) {
      phi[retval] = 0.0;
    }
    for (retval = 0; retval < q; retval = retval + 1) {
      theta[retval] = 0.0;
    }
    for (retval = 0; retval < P; retval = retval + 1) {
      PHI[retval] = 0.0;
    }
    for (retval = 0; retval < Q; retval = retval + 1) {
      THETA[retval] = 0.0;
    }
  }
  oup = (double *)malloc((long)(xreg_local._4_4_ - s * D) << 3);
  if (D < 1) {
    for (retval = 0; retval < xreg_local._4_4_; retval = retval + 1) {
      oup[retval] = pdStack_40[retval];
    }
  }
  else {
    xreg_local._4_4_ = diffs(pdStack_40,xreg_local._4_4_,D,s,oup);
  }
  oup_00 = (double *)malloc((long)(xreg_local._4_4_ - d) << 3);
  if (d < 1) {
    for (retval = 0; retval < xreg_local._4_4_; retval = retval + 1) {
      oup_00[retval] = oup[retval];
    }
  }
  else {
    xreg_local._4_4_ = diff(oup,xreg_local._4_4_,d,oup_00);
  }
  __dest = malloc((long)N * 8 * (long)(r + 1));
  if ((iVar2 == 0) && (imean == 1)) {
    for (retval = 0; retval < N; retval = retval + 1) {
      *(undefined8 *)((long)__dest + (long)retval * 8) = 0x3ff0000000000000;
    }
    if (0 < r) {
      memcpy((void *)((long)__dest + (long)N * 8),_p_local,(long)r * 8 * (long)N);
    }
    offset = local_13c + 1;
  }
  else if (0 < local_13c) {
    memcpy(__dest,_p_local,(long)local_13c * 8 * (long)N);
  }
  A = (double *)malloc((long)xreg_local._4_4_ * 8 * (long)(r + 1));
  if (0 < offset) {
    orig = N;
    if (0 < D) {
      orig = N - s * D;
      for (retval = 0; retval < offset; retval = retval + 1) {
        diffs((double *)((long)__dest + (long)(N * retval) * 8),N,D,s,A + orig * retval);
        memcpy((void *)((long)__dest + (long)(orig * retval) * 8),A + orig * retval,(long)orig << 3)
        ;
      }
    }
    if (0 < d) {
      for (retval = 0; retval < offset; retval = retval + 1) {
        diff((double *)((long)__dest + (long)(orig * retval) * 8),orig,d,
             A + xreg_local._4_4_ * retval);
      }
    }
    if (iVar2 == 0) {
      memcpy(A,__dest,(long)xreg_local._4_4_ * 8 * (long)offset);
    }
    iVar3 = rank(A,xreg_local._4_4_,offset);
    if (iVar3 < offset) {
      printf("Exogenous Variables are collinear. \n");
      free(oup);
      free(__dest);
      free(A);
      free(oup_00);
      return 7;
    }
  }
  if (0 < offset) {
    as154_min.params = reg_init(xreg_local._4_4_,offset);
    pdVar5 = (double *)malloc((long)offset * 8 * (long)offset);
    pdVar6 = (double *)malloc((long)xreg_local._4_4_ << 3);
    sigma = (double *)malloc((long)offset << 3);
    ipiv = (int *)malloc((long)offset << 3);
    setIntercept((reg_object)as154_min.params,0);
    regress((reg_object)as154_min.params,A,oup_00,pdVar6,pdVar5,0.95);
    for (retval = 0; retval < offset; retval = retval + 1) {
      sigma[retval] = *(double *)((long)as154_min.params + (long)retval * 0x20 + 0xb0);
      *(double *)(ipiv + (long)retval * 2) =
           *(double *)((long)as154_min.params + (long)retval * 0x20 + 200) * 10.0;
    }
    free(pdVar5);
    free(pdVar6);
    free_reg((reg_object)as154_min.params);
  }
  object = xlik_init(i,d,q,s,P,D,Q,offset,xreg_local._4_4_);
  iVar3 = object->offset;
  object->N = xreg_local._4_4_;
  object->M = offset;
  object->mean = *wmean;
  N_00 = object->pq;
  pdVar5 = (double *)malloc((long)N_00 << 3);
  pdVar6 = (double *)malloc((long)N_00 << 3);
  col = (double *)malloc((long)N_00 * 8 * (long)N_00);
  dx_00 = (double *)malloc((long)N_00 << 3);
  ipiv_00 = (int *)malloc((long)N_00 << 2);
  for (retval = 0; retval < i; retval = retval + 1) {
    pdVar5[retval] = phi[retval];
  }
  for (retval = 0; retval < q; retval = retval + 1) {
    pdVar5[i + retval] = -theta[retval];
  }
  for (retval = 0; retval < P; retval = retval + 1) {
    pdVar5[i + q + retval] = PHI[retval];
  }
  for (retval = 0; retval < Q; retval = retval + 1) {
    pdVar5[i + q + P + retval] = -THETA[retval];
  }
  if (0 < offset) {
    for (retval = 0; retval < offset; retval = retval + 1) {
      pdVar5[i + q + P + Q + retval] = sigma[retval];
    }
  }
  object->mean = 0.0;
  for (retval = 0; retval < xreg_local._4_4_; retval = retval + 1) {
    dVar1 = oup_00[retval];
    object->x[iVar3 + xreg_local._4_4_ * 2 + retval] = dVar1;
    object->x[iVar3 + retval] = dVar1;
  }
  for (retval = xreg_local._4_4_;
      SBORROW4(retval,xreg_local._4_4_ * 2) != retval + xreg_local._4_4_ * -2 < 0;
      retval = retval + 1) {
    object->x[iVar3 + retval] = 0.0;
  }
  if (0 < offset) {
    for (retval = xreg_local._4_4_ * 3; retval < (offset + 3) * xreg_local._4_4_;
        retval = retval + 1) {
      object->x[iVar3 + retval] = A[retval + xreg_local._4_4_ * -3];
    }
  }
  local_138 = (undefined1  [8])fas154x_seas;
  as154_min.funcpt = (_func_double_double_ptr_int_void_ptr *)object;
  iVar4 = fminunc((custom_function *)local_138,(custom_gradient *)0x0,N_00,pdVar5,1.0,d_local,pdVar6
                 );
  if (iVar4 == 0) {
    nd = 0;
  }
  else if (iVar4 == 0xf) {
    nd = 0xf;
  }
  else if (iVar4 == 4) {
    nd = 4;
  }
  else {
    nd = 1;
  }
  if (0 < q) {
    invertroot(q,pdVar6 + i);
  }
  if (0 < Q) {
    invertroot(Q,pdVar6 + (long)i + (long)q + (long)P);
  }
  for (retval = 0; retval < N_00 - offset; retval = retval + 1) {
    dx_00[retval] = 1.0;
  }
  for (retval = 0; retval < offset; retval = retval + 1) {
    dx_00[(N_00 - offset) + retval] = *(double *)(ipiv + (long)retval * 2);
  }
  hessian_fd((custom_function *)local_138,pdVar6,N_00,dx_00,object->eps,hess);
  mtranspose(hess,N_00,N_00,col);
  for (retval = 0; retval < N_00 * N_00; retval = retval + 1) {
    col[retval] = (double)((N - d) - s * D) * 0.5 * (hess[retval] + col[retval]);
  }
  ludecomp(col,N_00,ipiv_00);
  minverse(col,N_00,ipiv_00,hess);
  for (retval = 0; retval < i; retval = retval + 1) {
    phi[retval] = pdVar6[retval];
  }
  for (retval = 0; retval < q; retval = retval + 1) {
    theta[retval] = -pdVar6[i + retval];
  }
  for (retval = 0; retval < P; retval = retval + 1) {
    PHI[retval] = pdVar6[i + q + retval];
  }
  for (retval = 0; retval < Q; retval = retval + 1) {
    THETA[retval] = -pdVar6[i + q + P + retval];
  }
  if ((iVar2 == 0) && (imean == 1)) {
    *wmean = pdVar6[i + q + Q + P];
    if (1 < offset) {
      for (retval = 1; retval < offset; retval = retval + 1) {
        exog[retval + -1] = pdVar6[i + q + Q + P + retval];
      }
    }
  }
  else {
    *wmean = 0.0;
    for (retval = 0; retval < offset; retval = retval + 1) {
      exog[retval] = pdVar6[i + q + Q + P + retval];
    }
  }
  *var = object->ssq / (double)xreg_local._4_4_;
  for (retval = 0; retval < xreg_local._4_4_; retval = retval + 1) {
    resid[retval] = object->x[iVar3 + xreg_local._4_4_ + retval];
  }
  *loglik = object->loglik;
  free(pdVar5);
  free(pdVar6);
  free(oup_00);
  free(col);
  free(ipiv_00);
  free(dx_00);
  free(oup);
  free(__dest);
  free(A);
  if (0 < offset) {
    free(sigma);
    free(ipiv);
  }
  free_xlik(object);
  return nd;
}

Assistant:

int as154x(double *inp, int N, double *xreg, int optmethod, int p, int d, int q, int s, int P, int D, int Q, double *phi, double *theta, 
 	double *PHI, double *THETA, double *exog, int r, double *wmean, double *var,double *resid,double *loglik,double *hess,int cssml,int start,int imean) {
	int i,pq,retval,length,ret,ncxreg,nd,offset,N1,rnk,orig,ERR;
	double *b,*tf,*x,*dx,*thess,*XX,*varcovar,*res,*x0,*inp2,*U,*V,*SIG,*coeff,*sigma;
	int *ipiv;
	double maxstep;
	xlik_object obj;
	reg_object fit;

	length = N;// length of xreg as x is differenced first
	
	maxstep = 1.0;
	ncxreg = (xreg == NULL) ? 0 : r;
	nd = d + D;

	if (cssml == 1) {
		ERR = cssx(inp, N, xreg, optmethod, p, d, q, s, P, D, Q, phi, theta, PHI, THETA,exog,r, wmean, var, loglik, hess,start,imean);

		if ( ERR != 1) return ERR;

		ERR = checkroots_cerr(phi, &p, theta, &q, PHI, &P, THETA, &Q);
		if (ERR == 10 || ERR == 12) return ERR;
	}
	else {

		if (start == 0) {
			for (i = 0; i < p; ++i) phi[i] = 0.0;
			for (i = 0; i < q; ++i) theta[i] = 0.0;
			for (i = 0; i < P; ++i) PHI[i] = 0.0;
			for (i = 0; i < Q; ++i) THETA[i] = 0.0;
		}
	}

	inp2 = (double*)malloc(sizeof(double)* (N - s*D));

	if (D > 0) {
		N = diffs(inp, N, D, s, inp2);
	}
	else {
		for (i = 0; i < N; ++i) {
			inp2[i] = inp[i];
		}
	}

	x = (double*)malloc(sizeof(double)* (N - d));

	if (d > 0) {
		N = diff(inp2, N, d, x); // No need to demean x
	}
	else {
		for (i = 0; i < N; ++i) {
			x[i] = inp2[i];
		}
	}

	//mdisplay(x,1,N);

	x0 = (double*) malloc(sizeof(double)*length*(r+1));

	if (nd == 0 && imean == 1) {
		for(i = 0; i < length;++i) {
			x0[i] = 1.0;
		}
		if (r > 0) {
			memcpy(x0+length,xreg,sizeof(double)*r*length);
		}
		ncxreg++;
	} else {
		if (ncxreg > 0) {
			memcpy(x0,xreg,sizeof(double)*ncxreg*length);
		}
	}
	XX = (double*) malloc(sizeof(double)*N*(r+1));

	if (ncxreg > 0) {
		N1 = length;
		// x0 differenced and stored back in x0. Also stored in XX
		if (D > 0) {
			N1 = length - s*D;
			for(i = 0; i < ncxreg;++i) {
				diffs(x0+length*i,length,D,s,XX+N1*i);
				memcpy(x0+N1*i,XX+N1*i,sizeof(double)*N1);
			}
		} 
		// x0 differenced to XX
		if (d > 0) {
			for(i = 0; i < ncxreg;++i) {
				diff(x0+N1*i,N1,d,XX+N*i);
			}
		} 
		// Copy x0 to XX
		if (nd == 0) {
			memcpy(XX,x0,sizeof(double)*N*ncxreg);
		}

		rnk = rank(XX,N,ncxreg);

		if (rnk < ncxreg) {
			ERR = 7;
			printf("Exogenous Variables are collinear. \n");
			free(inp2);
			free(x0);
			free(XX);
			free(x);
			return ERR;
		}

	}


	orig = 0;

	if (ncxreg > 0) {
		if (ncxreg == 1) orig = 1;

		fit = reg_init(N,ncxreg);

		varcovar = (double*)malloc(sizeof(double)*ncxreg*ncxreg);
		res = (double*)malloc(sizeof(double)*N);
		coeff = (double*)malloc(sizeof(double)*ncxreg);
		sigma = (double*)malloc(sizeof(double)*ncxreg);

		setIntercept(fit,0);
		regress(fit,XX,x,res,varcovar,0.95);

		for(i = 0; i < ncxreg;++i) {
			coeff[i] = (fit->beta+i)->value;
			sigma[i] = 10.0 * (fit->beta+i)->stdErr;
			//printf("coeff %g sigma %g ",coeff[i],sigma[i]);
		}

		free(varcovar);
		free(res);
		free_reg(fit);
	}

	
 
	obj = xlik_init(p,d,q,s,P,D,Q,ncxreg,N);


	offset = obj->offset;

	obj->N = N;
	obj->M = ncxreg;
	obj->mean = *wmean;
	pq = obj->pq;
	b = (double*)malloc(sizeof(double)* pq);
	tf = (double*)malloc(sizeof(double)* pq);
	thess = (double*)malloc(sizeof(double)* pq*pq);
	dx = (double*)malloc(sizeof(double)* pq);
	ipiv = (int*)malloc(sizeof(int)* pq);


	// Initialize Parameters

	//mdisplay(theta,1,q);
	//mdisplay(THETA,1,Q);

	for (i = 0; i < p; ++i) {
		b[i] = phi[i];
	}
	for (i = 0; i < q; ++i) {
		b[p + i] = -theta[i];
	}
	for (i = 0; i < P; ++i) {
		b[p + q + i] = PHI[i];
	}
	for (i = 0; i < Q; ++i) {
		b[p + q + P + i] = -THETA[i];
	}

	if (ncxreg > 0) {
		for(i = 0; i < ncxreg;++i) {
			b[p + q + P + Q + i] = coeff[i]; // exog
		}
	}

	


	obj->mean = 0.0;

	// Set data vector

	for (i = 0; i < N; ++i) {
		obj->x[offset + i] = obj->x[offset + 2 * N + i] = x[i];
	}

	for (i = N; i < 2 * N; ++i) {
		obj->x[offset + i] = 0.0;
	}

	if (ncxreg > 0) {
		for(i = 3 * N; i < (3 + ncxreg)*N; ++i) {
			obj->x[offset + i] = XX[i - 3*N];
		}
	}


	custom_function as154_min = { fas154x_seas, obj };
	retval = fminunc(&as154_min, NULL, pq, b,maxstep, optmethod, tf);

	if (retval == 0) {
		ret = 0;
	}
	else if (retval == 15) {
		ret = 15;
	}
	else if (retval == 4) {
		ret = 4;
	}
	else {
		ret = 1;
	}

	if (q > 0) {
		invertroot(q,tf+p);
	}

	if (Q > 0) {
		invertroot(Q,tf+p+q+P);
	}



	for (i = 0; i < pq - ncxreg; ++i) {
		dx[i] = 1.0;
	}

	for(i = 0; i < ncxreg; ++i) {
		dx[pq - ncxreg + i] = sigma[i];
	}

	hessian_fd(&as154_min, tf, pq, dx, obj->eps, hess);
	
	mtranspose(hess, pq, pq, thess);
	

	for (i = 0; i < pq*pq; ++i) {
		thess[i] = (length - d - s*D) * 0.5 * (hess[i] + thess[i]);
	}
	

	ludecomp(thess, pq, ipiv);
	minverse(thess, pq, ipiv, hess);


	for (i = 0; i < p; ++i) {
		phi[i] = tf[i];
	}
	for (i = 0; i < q; ++i) {
		theta[i] = -tf[p + i];
	}
	for (i = 0; i < P; ++i) {
		PHI[i] = tf[p + q + i];
	}
	for (i = 0; i < Q; ++i) {
		THETA[i] = -tf[p + q + P + i];
	}
	

	if (nd == 0 && imean == 1) {
		*wmean = tf[p + q + Q + P];
		if (ncxreg > 1) {
			for(i = 1; i < ncxreg;++i) {
				exog[i-1] = tf[p + q + Q + P + i];
			}
		}
	} else {
		*wmean = 0.0;
		for(i = 0; i < ncxreg; ++i) {
			exog[i] = tf[p + q + Q + P + i];
		}
	}


	*var = (obj->ssq) / (double) N;

	for (i = 0; i < N; ++i) {
		resid[i] = obj->x[offset + N + i];
	}
	*loglik = obj->loglik;

	free(b);
	free(tf);
	free(x);
	free(thess);
	free(ipiv);
	free(dx);
	free(inp2);
	free(x0);
	free(XX); 
	if (ncxreg > 0) {
		free(coeff);
		free(sigma);
	}
	
	free_xlik(obj);
	return ret;
}